

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O2

char * get_kde_val(char *str,char *key)

{
  size_t sVar1;
  char *pcVar2;
  
  while( true ) {
    if (*str != *key) break;
    str = str + 1;
    key = key + 1;
  }
  if (*str == '=' && *key == '\0') {
    sVar1 = strlen(str);
    if (str[sVar1 - 1] == '\n') {
      str[sVar1 - 1] = '\0';
    }
    pcVar2 = str + 1;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static char *
get_kde_val(char       *str,
            const char *key) {
  while (*str == *key) {
    str ++;
    key ++;
  }

  if (*key == '\0' && *str == '=') {
    if (str[strlen(str) - 1] == '\n') str[strlen(str) - 1] = '\0';

    return (str + 1);
  }

  return ((char *)0);
}